

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O2

vector<ear::PolarPosition,_std::allocator<ear::PolarPosition>_> * __thiscall
ear::Layout::nominalPositions
          (vector<ear::PolarPosition,_std::allocator<ear::PolarPosition>_> *__return_storage_ptr__,
          Layout *this)

{
  pointer pCVar1;
  pointer pCVar2;
  PolarPosition local_d0;
  Channel local_b8;
  
  (__return_storage_ptr__->
  super__Vector_base<ear::PolarPosition,_std::allocator<ear::PolarPosition>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<ear::PolarPosition,_std::allocator<ear::PolarPosition>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<ear::PolarPosition,_std::allocator<ear::PolarPosition>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar1 = (this->_channels).super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (pCVar2 = (this->_channels).super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>.
                _M_impl.super__Vector_impl_data._M_start; pCVar2 != pCVar1; pCVar2 = pCVar2 + 1) {
    Channel::Channel(&local_b8,pCVar2);
    Channel::polarPositionNominal(&local_d0,&local_b8);
    std::vector<ear::PolarPosition,_std::allocator<ear::PolarPosition>_>::
    emplace_back<ear::PolarPosition>(__return_storage_ptr__,&local_d0);
    Channel::~Channel(&local_b8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<PolarPosition> Layout::nominalPositions() const {
    std::vector<PolarPosition> pos;
    std::transform(
        _channels.begin(), _channels.end(), std::back_inserter(pos),
        [](Channel c) -> PolarPosition { return c.polarPositionNominal(); });
    return pos;
  }